

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

bool_t prf_model_vertex_palette_optimize(prf_model_t *model)

{
  uint uVar1;
  uint *puVar2;
  prf_cb_t callback;
  prf_cb_t callback_00;
  int iVar3;
  void *__s;
  void *pvVar4;
  void *pvVar5;
  long in_RDI;
  int count_1;
  int i_2;
  uint16_t *uint16ptr_1;
  prf_vertex_pool_t *pool;
  uint pos;
  int i_1;
  int num;
  uint16_t *uint16ptr;
  uint8_t *buffer;
  uint8_t *origdata;
  uint8_t *ptr;
  uint32_t orig_length;
  uint32_t datasize;
  uint32_t offset;
  int count;
  int i;
  uint8_t *rlt;
  uint32_t length;
  prf_cb_t fix_cb;
  prf_cb_t tag_cb;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  _func_int_void_ptr_void_ptr *in_stack_ffffffffffffff68;
  long *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff7c;
  pool_t pool_id;
  int local_80;
  uint *local_60;
  uint local_54;
  uint local_4c;
  int local_44;
  uint local_34;
  bool_t local_4;
  
  local_34 = **(uint **)(*(long *)(in_RDI + 0x10) + 8);
  if (*(long *)(in_RDI + 0x18) != 0) {
    iVar3 = prf_array_count((void *)0x108466);
    for (local_44 = 0; local_44 < iVar3; local_44 = local_44 + 1) {
      local_34 = *(int *)(*(long *)(*(long *)(in_RDI + 0x18) + (long)local_44 * 8) + 0xc) + local_34
      ;
    }
  }
  __s = malloc((ulong)local_34);
  if (__s == (void *)0x0) {
    prf_error(9,"memory allocation error (malloc returned NULL)");
    local_4 = 0;
  }
  else {
    memset(__s,0,(ulong)local_34);
    callback.data = in_stack_ffffffffffffff70;
    callback.func = in_stack_ffffffffffffff68;
    prf_model_traverse_io
              ((prf_model_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),callback
              );
    local_4c = 0;
    pvVar4 = malloc((ulong)local_34);
    if (pvVar4 == (void *)0x0) {
      prf_error(9,"memory allocation error (malloc returned NULL)");
      free(__s);
      local_4 = 0;
    }
    else {
      puVar2 = *(uint **)(*(long *)(in_RDI + 0x10) + 8);
      uVar1 = *puVar2;
      local_60 = puVar2 + 2;
      while( true ) {
        if (uVar1 <= (uint)((int)local_60 - (int)puVar2)) break;
        if (*(int *)((long)__s + ((long)local_60 - (long)puVar2)) == 0) {
          local_4c = *(ushort *)((long)local_60 + 2) + local_4c;
        }
        else {
          memmove((void *)((long)pvVar4 + (long)local_60 + (-(ulong)local_4c - (long)puVar2)),
                  local_60,(ulong)*(ushort *)((long)local_60 + 2));
          *(uint *)((long)__s + ((long)local_60 - (long)puVar2)) =
               ((int)local_60 - (int)puVar2) - local_4c;
        }
        local_60 = (uint *)((long)local_60 + (long)(int)(uint)*(ushort *)((long)local_60 + 2));
      }
      local_54 = *puVar2;
      if (*(long *)(in_RDI + 0x18) != 0) {
        iVar3 = prf_array_count((void *)0x1086ce);
        for (local_80 = 0; local_80 < iVar3; local_80 = local_80 + 1) {
          in_stack_ffffffffffffff70 = *(long **)(*(long *)(in_RDI + 0x18) + (long)local_80 * 8);
          for (in_stack_ffffffffffffff7c = 0;
              in_stack_ffffffffffffff7c < *(uint *)((long)in_stack_ffffffffffffff70 + 0xc);
              in_stack_ffffffffffffff7c =
                   *(ushort *)(in_stack_ffffffffffffff68 + 2) + in_stack_ffffffffffffff7c) {
            in_stack_ffffffffffffff68 =
                 (_func_int_void_ptr_void_ptr *)
                 (*in_stack_ffffffffffffff70 + (ulong)in_stack_ffffffffffffff7c);
            if (*(int *)((long)__s + (ulong)in_stack_ffffffffffffff7c + (ulong)local_54) == 0) {
              local_4c = *(ushort *)(in_stack_ffffffffffffff68 + 2) + local_4c;
            }
            else {
              memmove((void *)((long)pvVar4 +
                              ((ulong)(local_54 + in_stack_ffffffffffffff7c) - (ulong)local_4c)),
                      in_stack_ffffffffffffff68,(ulong)*(ushort *)(in_stack_ffffffffffffff68 + 2));
              *(uint *)((long)__s + (ulong)(local_54 + in_stack_ffffffffffffff7c)) =
                   (local_54 + in_stack_ffffffffffffff7c) - local_4c;
            }
          }
          local_54 = *(int *)((long)in_stack_ffffffffffffff70 + 0xc) + local_54;
        }
      }
      pool_id = (pool_t)(in_stack_ffffffffffffff7c >> 0x10);
      if (*(long *)(in_RDI + 0x18) != 0) {
        in_stack_ffffffffffffff60 = prf_array_count((void *)0x108808);
        for (in_stack_ffffffffffffff64 = 0; pool_id = (pool_t)(in_stack_ffffffffffffff7c >> 0x10),
            in_stack_ffffffffffffff64 < in_stack_ffffffffffffff60;
            in_stack_ffffffffffffff64 = in_stack_ffffffffffffff64 + 1) {
          free((void *)**(undefined8 **)
                         (*(long *)(in_RDI + 0x18) + (long)in_stack_ffffffffffffff64 * 8));
          free(*(void **)(*(long *)(in_RDI + 0x18) + (long)in_stack_ffffffffffffff64 * 8));
        }
        prf_array_free((void *)0x108873);
        *(undefined8 *)(in_RDI + 0x18) = 0;
      }
      if (*(short *)(in_RDI + 8) == 0) {
        free(*(void **)(*(long *)(in_RDI + 0x10) + 8));
        pvVar4 = realloc(pvVar4,(ulong)(local_54 - local_4c));
        *(void **)(*(long *)(in_RDI + 0x10) + 8) = pvVar4;
      }
      else {
        if (**(uint **)(*(long *)(in_RDI + 0x10) + 8) < local_54 - local_4c) {
          pvVar5 = pool_malloc(pool_id,in_stack_ffffffffffffff78);
          *(void **)(*(long *)(in_RDI + 0x10) + 8) = pvVar5;
          memcpy(*(void **)(*(long *)(in_RDI + 0x10) + 8),pvVar4,(ulong)(local_54 - local_4c));
        }
        else {
          memcpy(*(void **)(*(long *)(in_RDI + 0x10) + 8),pvVar4,(ulong)(local_54 - local_4c));
        }
        free(pvVar4);
      }
      **(int **)(*(long *)(in_RDI + 0x10) + 8) = local_54 - local_4c;
      callback_00.data = in_stack_ffffffffffffff70;
      callback_00.func = in_stack_ffffffffffffff68;
      prf_model_traverse_io
                ((prf_model_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 callback_00);
      free(__s);
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

bool_t
prf_model_vertex_palette_optimize(
    prf_model_t * model )
{
    prf_cb_t tag_cb, fix_cb;

    uint32_t length = 0;
    uint8_t * rlt = NULL;

    assert( model != NULL && model->vertex_palette != NULL );

    do { /* create vertex list pool */
        length = ((uint32_t *)(model->vertex_palette->data))[0];
        if ( model->vertextras != NULL ) {
            int i, count;
            count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ )
                length += model->vertextras[i]->position;
        }
        rlt = (uint8_t *)malloc( length );
        if ( rlt == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            return FALSE;
        }
        memset( rlt, 0, length );
    } while ( FALSE );

    do { /* traverse and tag vertices */
        prf_cb_func( tag_cb, vt_tag_cb );
        prf_cb_data( tag_cb, rlt );
        prf_model_traverse_io( model, tag_cb );
    } while ( FALSE );

    do { /* compact vertex list and create reverse lookup table */
        uint32_t offset = 0;
        uint32_t datasize = 0;
        uint32_t orig_length = 0;
        uint8_t * ptr = NULL, * origdata = NULL;
        uint8_t * buffer = (uint8_t *)malloc( length );

        if ( buffer == NULL ) {
            prf_error( 9, "memory allocation error (malloc returned NULL)" );
            free( rlt );
            return FALSE;
        }

        origdata = model->vertex_palette->data;
        datasize = ((uint32_t *)(origdata))[0];
       
        /* node for node, check if tagged, and update move offset */
        ptr = origdata + 8;
        while ( ((unsigned int) (ptr - origdata)) < datasize ) {
            uint16_t * uint16ptr = (uint16_t *) ptr;
            if ( ((uint32_t *)(rlt+(ptr-origdata)))[0] != 0 ) {
                /* vertex is in use, move vertex into new buffer */
                memmove( buffer + (ptr-origdata) - offset, ptr, uint16ptr[1] );
                /* set reverse lookup index in rtl table */
                ((uint32_t *)(rlt+(ptr-origdata)))[0] = (ptr-origdata) - offset;
            } else {
                /* vertex not in use => accumulate offset */
                offset += uint16ptr[1]; /* add node length to offset */
            }
            ptr += uint16ptr[1];
        }
        orig_length = ((uint32_t *)(origdata))[0];
        if ( model->vertextras != NULL ) {
            int num, i;
            num = prf_array_count( model->vertextras );
            for ( i = 0; i < num; i++ ) {
                unsigned int pos = 0;
                prf_vertex_pool_t * pool = model->vertextras[i];
                while ( pos < pool->position ) {
                     uint16_t * uint16ptr = (uint16_t *) (pool->data + pos);
                     if ( ((uint32_t *)(rlt + orig_length + pos))[0] != 0 ) {
                         /* vertex in use, move vertex to buffer */
                         memmove( buffer + (orig_length + pos) - offset,
                             uint16ptr, uint16ptr[1] );
                         /* create reverse lookup */
                         ((uint32_t *)(rlt + (orig_length+pos)))[0] =
                                (orig_length+pos) - offset;
                     } else {
                         /* vertex not in use, accumulate offset */
                         offset += uint16ptr[1];
                     }
                     pos += uint16ptr[1];
                }
                orig_length += pool->position;
            }
        }

        /* move buffer back into model with vertextras */
        if ( model->vertextras != NULL ) {
            int i, count = prf_array_count( model->vertextras );
            for ( i = 0; i < count; i++ ) {
                free( model->vertextras[i]->data );
                free( model->vertextras[i] );
            }
            prf_array_free( model->vertextras );
            model->vertextras = NULL;
        }

        if ( model->mempool_id == 0 ) {
            free( model->vertex_palette->data );
            model->vertex_palette->data = 
	      (uint8_t *)realloc( buffer, orig_length-offset );
        } else {
            if ( ((uint32_t *)model->vertex_palette->data)[0] >=
                 (orig_length - offset) ) {
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            } else {
                /* some memory is wasted here until memory pool is freed */
	      model->vertex_palette->data = (uint8_t *)
                    pool_malloc( model->mempool_id, orig_length - offset );
                memcpy( model->vertex_palette->data, buffer,
                    orig_length - offset );
            }
            free( buffer );
        }
        ((uint32_t *)model->vertex_palette->data)[0] = orig_length - offset;
    } while ( FALSE );

    do { /* traverse and fix vertex list offsets */
        prf_cb_func( fix_cb, vt_fix_cb );
        prf_cb_data( fix_cb, rlt );
        prf_model_traverse_io( model, fix_cb );
        free( rlt );
    } while ( FALSE );

    return TRUE;
}